

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance>::
emplaceRealloc<slang::analysis::ClockInference::ExpansionInstance>
          (SmallVectorBase<slang::analysis::ClockInference::ExpansionInstance> *this,pointer pos,
          ExpansionInstance *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  TimingControl *pTVar3;
  undefined7 uVar4;
  ExpansionInstance *__cur_1;
  pointer pEVar5;
  pointer pEVar6;
  pointer pEVar7;
  pointer pEVar8;
  EVP_PKEY_CTX *pEVar9;
  EVP_PKEY_CTX *ctx;
  long lVar10;
  
  if (this->len == 0x555555555555555) {
    detail::throwLengthError();
  }
  pEVar9 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar9 < ctx) {
    pEVar9 = ctx;
  }
  if (0x555555555555555 - uVar1 < uVar1) {
    pEVar9 = (EVP_PKEY_CTX *)0x555555555555555;
  }
  lVar10 = (long)pos - (long)this->data_;
  pEVar5 = (pointer)operator_new((long)pEVar9 * 0x18);
  *(undefined8 *)((long)pEVar5 + lVar10 + 0x10) = *(undefined8 *)&args->hasInferredClockArg;
  pTVar3 = args->clock;
  *(undefined8 *)((long)pEVar5 + lVar10) = args->expr;
  ((undefined8 *)((long)pEVar5 + lVar10))[1] = pTVar3;
  pEVar8 = this->data_;
  pEVar6 = pEVar8 + this->len;
  pEVar7 = pEVar5;
  if (pEVar6 == pos) {
    for (; pEVar8 != pos; pEVar8 = pEVar8 + 1) {
      uVar4 = *(undefined7 *)&pEVar8->field_0x11;
      pEVar7->hasInferredClockArg = pEVar8->hasInferredClockArg;
      *(undefined7 *)&pEVar7->field_0x11 = uVar4;
      pTVar3 = pEVar8->clock;
      pEVar7->expr = pEVar8->expr;
      pEVar7->clock = pTVar3;
      pEVar7 = pEVar7 + 1;
    }
  }
  else {
    for (; pEVar8 != pos; pEVar8 = pEVar8 + 1) {
      ctx = *(EVP_PKEY_CTX **)&pEVar8->hasInferredClockArg;
      *(EVP_PKEY_CTX **)&pEVar7->hasInferredClockArg = ctx;
      pTVar3 = pEVar8->clock;
      pEVar7->expr = pEVar8->expr;
      pEVar7->clock = pTVar3;
      pEVar7 = pEVar7 + 1;
    }
    puVar2 = (undefined8 *)(lVar10 + (long)pEVar5);
    for (; pos != pEVar6; pos = pos + 1) {
      puVar2[5] = *(undefined8 *)&pos->hasInferredClockArg;
      pTVar3 = pos->clock;
      puVar2[3] = pos->expr;
      puVar2[4] = pTVar3;
      puVar2 = puVar2 + 3;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar9;
  this->data_ = pEVar5;
  return (pointer)((long)pEVar5 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}